

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::FormalArgumentSymbol::getDefaultValue(FormalArgumentSymbol *this)

{
  Scope *pSVar1;
  Type *argType;
  Expression *pEVar2;
  LookupLocation LVar3;
  ASTContext context;
  ASTContext local_50;
  
  if (this->defaultVal != (Expression *)0x0) {
    return this->defaultVal;
  }
  if (this->defaultValSyntax == (ExpressionSyntax *)0x0) {
    pEVar2 = (Expression *)0x0;
  }
  else {
    pSVar1 = (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.parentScope;
    LVar3 = LookupLocation::after((Symbol *)this);
    local_50.lookupIndex = LVar3.index;
    local_50.flags.m_bits = 0x100000000;
    local_50.instanceOrProc = (Symbol *)0x0;
    local_50.firstTempVar = (TempVarSymbol *)0x0;
    local_50.randomizeDetails = (RandomizeDetails *)0x0;
    local_50.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_50.scope.ptr = pSVar1;
    argType = DeclaredType::getType(&(this->super_VariableSymbol).super_ValueSymbol.declaredType);
    pEVar2 = Expression::bindArgument
                       (argType,this->direction,
                        (bitmask<slang::ast::VariableFlags>)
                        (underlying_type)*(undefined4 *)&(this->super_VariableSymbol).flags,
                        this->defaultValSyntax,&local_50);
    this->defaultVal = pEVar2;
  }
  return pEVar2;
}

Assistant:

const Expression* FormalArgumentSymbol::getDefaultValue() const {
    if (defaultVal || !defaultValSyntax)
        return defaultVal;

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    ASTContext context(*scope, LookupLocation::after(*this), ASTFlags::NotADriver);
    defaultVal = &Expression::bindArgument(getType(), direction, flags, *defaultValSyntax, context);
    return defaultVal;
}